

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall kratos::InsertClockIRVisitor::visit(InsertClockIRVisitor *this,Generator *gen)

{
  Port *left;
  Port *this_00;
  bool bVar1;
  PortType PVar2;
  int iVar3;
  VarType VVar4;
  undefined4 extraout_var;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *this_03;
  Var **ppVVar5;
  reference pvVar6;
  element_type *right;
  undefined1 local_80 [8];
  shared_ptr<kratos::Port> parent_port;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_60;
  undefined1 local_58 [8];
  value_type stmt;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  Port *local_28;
  Port *clk_en;
  Generator *parent;
  Generator *gen_local;
  InsertClockIRVisitor *this_local;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *this_01;
  
  if ((((this->clk_en_ != (Port *)0x0) &&
       (parent = gen, gen_local = (Generator *)this, bVar1 = has_don_touch(&gen->super_IRNode),
       !bVar1)) && (bVar1 = Generator::external(parent), !bVar1)) &&
     (((bVar1 = Generator::is_stub(parent), !bVar1 &&
       (clk_en = (Port *)Generator::parent_generator(parent),
       (Generator *)clk_en != (Generator *)0x0)) && (parent != this->top_)))) {
    bVar1 = Generator::has_port(parent,&this->clk_en_name_);
    if (bVar1) {
      Generator::get_port((Generator *)&sources,(string *)parent);
      local_28 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&sources);
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&sources);
      iVar3 = (*(local_28->super_Var).super_IRNode._vptr_IRNode[0x10])();
      this_01 = (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 *)CONCAT44(extraout_var,iVar3);
      bVar1 = std::
              unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
              ::empty(this_01);
      if (!bVar1) {
        stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin(this_01);
        this_02 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::__detail::
                     _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                     operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                                *)&stmt.
                                   super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
        this_03 = std::
                  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_02);
        ppVVar5 = AssignStmt::right(this_03);
        VVar4 = Var::type(*ppVVar5);
        if (VVar4 != ConstValue) {
          return;
        }
        local_60._M_cur =
             (__node_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin(this_01);
        pvVar6 = std::__detail::
                 _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                           ((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                             *)&local_60);
        std::shared_ptr<kratos::AssignStmt>::shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_58,pvVar6);
        (*(local_28->super_Var).super_IRNode._vptr_IRNode[0x12])(local_28,1);
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_58)
        ;
      }
    }
    else {
      local_28 = Generator::port(parent,this->clk_en_,true);
      PVar2 = Port::port_type(local_28);
      if (PVar2 != ClockEnable) {
        (*(local_28->super_Var).super_IRNode._vptr_IRNode[0x2b])(local_28,4);
      }
    }
    Generator::get_port((Generator *)local_80,(string *)clk_en);
    this_00 = clk_en;
    left = local_28;
    right = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_80);
    Generator::wire((Generator *)this_00,&left->super_Var,&right->super_Var);
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_80);
  }
  return;
}

Assistant:

void visit(Generator* gen) override {
        if (!clk_en_) return;
        if (has_don_touch(gen)) return;
        if (gen->external() || gen->is_stub()) return;
        auto* parent = gen->parent_generator();
        if (!parent || gen == top_) return;

        Port* clk_en;
        if (!gen->has_port(clk_en_name_)) {
            clk_en = &gen->port(*clk_en_);
            if (clk_en->port_type() != PortType::ClockEnable)
                clk_en->set_port_type(PortType::ClockEnable);
        } else {
            clk_en = gen->get_port(clk_en_name_).get();
            // notice that if it's being wired to a constant, we need to disconnect it
            auto const& sources = clk_en->sources();
            if (!sources.empty()) {
                if ((*(sources.begin()))->right()->type() == VarType::ConstValue) {
                    auto stmt = *(sources.begin());
                    clk_en->clear_sources(true);
                } else {
                    // no need to wire
                    return;
                }
            }
        }
        // wire to the top
        auto parent_port = parent->get_port(clk_en_name_);
        parent->wire(*clk_en, *parent_port);
    }